

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O2

void __thiscall
OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
AttribKernelT(AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
              *this)

{
  string local_40;
  allocator local_19;
  
  TriConnectivity::TriConnectivity((TriConnectivity *)this);
  *(undefined ***)this = &PTR__PolyConnectivity_001ea500;
  (this->points_).super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.super_BaseHandle.idx_ = -1;
  (this->vertex_normals_).super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.super_BaseHandle.idx_
       = -1;
  (this->vertex_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.
  super_BaseHandle.idx_ = -1;
  (this->vertex_texcoords1D_).super_BasePropHandleT<double>.super_BaseHandle.idx_ = -1;
  (this->vertex_texcoords2D_).super_BasePropHandleT<OpenMesh::VectorT<double,_2>_>.super_BaseHandle.
  idx_ = -1;
  (this->vertex_texcoords3D_).super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->halfedge_texcoords1D_).super_BasePropHandleT<double>.super_BaseHandle.idx_ = -1;
  (this->halfedge_texcoords2D_).super_BasePropHandleT<OpenMesh::VectorT<double,_2>_>.
  super_BaseHandle.idx_ = -1;
  (this->halfedge_texcoords3D_).super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
  super_BaseHandle.idx_ = -1;
  (this->halfedge_normals_).super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->halfedge_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.
  super_BaseHandle.idx_ = -1;
  (this->edge_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->face_normals_).super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.super_BaseHandle.idx_ =
       -1;
  (this->face_colors_).super_BasePropHandleT<OpenMesh::VectorT<unsigned_char,_3>_>.super_BaseHandle.
  idx_ = -1;
  (this->face_texture_index_).super_BasePropHandleT<int>.super_BaseHandle.idx_ = -1;
  (this->data_vpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_vpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_hpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_epph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  (this->data_fpph_).
  super_BasePropHandleT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  .super_BaseHandle.idx_ = -1;
  this->refcount_vnormals_ = 0;
  this->refcount_vcolors_ = 0;
  this->refcount_vtexcoords1D_ = 0;
  this->refcount_vtexcoords2D_ = 0;
  this->refcount_vtexcoords3D_ = 0;
  this->refcount_htexcoords1D_ = 0;
  this->refcount_htexcoords2D_ = 0;
  this->refcount_htexcoords3D_ = 0;
  this->refcount_henormals_ = 0;
  this->refcount_hecolors_ = 0;
  this->refcount_ecolors_ = 0;
  this->refcount_fnormals_ = 0;
  this->refcount_fcolors_ = 0;
  this->refcount_ftextureIndex_ = 0;
  std::__cxx11::string::string((string *)&local_40,"v:points",&local_19);
  BaseKernel::add_property<OpenMesh::VectorT<double,3>>((BaseKernel *)this,&this->points_,&local_40)
  ;
  std::__cxx11::string::~string((string *)&local_40);
  request_vertex_normals(this);
  request_vertex_colors(this);
  ArrayKernel::request_vertex_status((ArrayKernel *)this);
  ArrayKernel::request_halfedge_status((ArrayKernel *)this);
  ArrayKernel::request_edge_status((ArrayKernel *)this);
  request_edge_colors(this);
  request_face_normals(this);
  request_face_colors(this);
  ArrayKernel::request_face_status((ArrayKernel *)this);
  std::__cxx11::string::string((string *)&local_40,"<vprop>",&local_19);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::VertexT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_vpph_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"<fprop>",&local_19);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_fpph_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"<hprop>",&local_19);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_hpph_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"<eprop>",&local_19);
  BaseKernel::
  add_property<OpenMesh::DefaultTraits::EdgeT<OpenMesh::FinalMeshItemsT<MyTraits,true>::ITraits,OpenMesh::FinalMeshItemsT<MyTraits,true>::Refs>>
            ((BaseKernel *)this,&this->data_epph_,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

AttribKernelT()
  : refcount_vnormals_(0),
    refcount_vcolors_(0),
    refcount_vtexcoords1D_(0),
    refcount_vtexcoords2D_(0),
    refcount_vtexcoords3D_(0),
    refcount_htexcoords1D_(0),
    refcount_htexcoords2D_(0),
    refcount_htexcoords3D_(0),
    refcount_henormals_(0),
    refcount_hecolors_(0),
    refcount_ecolors_(0),
    refcount_fnormals_(0),
    refcount_fcolors_(0),
    refcount_ftextureIndex_(0)
  {
    this->add_property( points_, "v:points" );

    if (VAttribs & Attributes::Normal)
      request_vertex_normals();

    if (VAttribs & Attributes::Color)
      request_vertex_colors();

    if (VAttribs & Attributes::TexCoord1D)
      request_vertex_texcoords1D();

    if (VAttribs & Attributes::TexCoord2D)
      request_vertex_texcoords2D();

    if (VAttribs & Attributes::TexCoord3D)
      request_vertex_texcoords3D();

    if (HAttribs & Attributes::TexCoord1D)
      request_halfedge_texcoords1D();

    if (HAttribs & Attributes::TexCoord2D)
      request_halfedge_texcoords2D();

    if (HAttribs & Attributes::TexCoord3D)
      request_halfedge_texcoords3D();

    if (HAttribs & Attributes::Color)
      request_halfedge_colors();

    if (VAttribs & Attributes::Status)
      Connectivity::request_vertex_status();

    if (HAttribs & Attributes::Status)
      Connectivity::request_halfedge_status();

    if (HAttribs & Attributes::Normal)
      request_halfedge_normals();

    if (EAttribs & Attributes::Status)
      Connectivity::request_edge_status();
    
    if (EAttribs & Attributes::Color)
      request_edge_colors();

    if (FAttribs & Attributes::Normal)
      request_face_normals();

    if (FAttribs & Attributes::Color)
      request_face_colors();

    if (FAttribs & Attributes::Status)
      Connectivity::request_face_status();

    if (FAttribs & Attributes::TextureIndex)
      request_face_texture_index();

    //FIXME: data properties might actually cost storage even
    //if there are no data traits??
    this->add_property(data_vpph_);
    this->add_property(data_fpph_);
    this->add_property(data_hpph_);
    this->add_property(data_epph_);
  }